

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O3

void aom_internal_error_copy(aom_internal_error_info *info,aom_internal_error_info *src)

{
  if (src->has_detail != 0) {
    aom_internal_error(info,src->error_code,"%s",src->detail);
    return;
  }
  aom_internal_error(info,src->error_code,(char *)0x0,src);
  return;
}

Assistant:

void aom_internal_error_copy(struct aom_internal_error_info *info,
                             const struct aom_internal_error_info *src) {
  assert(info != src);
  assert(!src->setjmp);

  if (!src->has_detail) {
    aom_internal_error(info, src->error_code, NULL);
  } else {
    aom_internal_error(info, src->error_code, "%s", src->detail);
  }
}